

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::memory::anon_unknown_0::RandomMemoryMappingInstance::iterate
          (TestStatus *__return_storage_ptr__,RandomMemoryMappingInstance *this)

{
  Random *pRVar1;
  pointer *pppMVar2;
  pointer *pppMVar3;
  uint *puVar4;
  uchar uVar5;
  uchar uVar6;
  pointer ppMVar7;
  TotalMemoryTracker *pTVar8;
  VkDeviceMemory obj;
  ReferenceMemory *pRVar9;
  pointer puVar10;
  pointer puVar11;
  pointer puVar12;
  pointer ppMVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  undefined1 auVar20 [12];
  pointer pVVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  Handle<(vk::HandleType)7> HVar24;
  RandomMemoryMappingInstance *pRVar25;
  pointer first;
  pointer last;
  byte bVar26;
  int ndx;
  deUint32 dVar27;
  deBool dVar28;
  deUint32 dVar29;
  VkResult VVar30;
  VkDevice pVVar31;
  DeviceInterface *pDVar32;
  MemoryObject_conflict *pMVar33;
  MemoryHeap *pMVar34;
  pointer pMVar35;
  value_type pMVar36;
  MemoryMapping *pMVar37;
  size_t sVar38;
  pointer ppMVar39;
  TestError *this_00;
  VkDeviceSize VVar40;
  pointer count;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  VkDeviceSize total_1;
  pointer pSVar44;
  ulong uVar45;
  VkDeviceSize VVar46;
  uint uVar47;
  long lVar48;
  long lVar49;
  undefined1 *puVar50;
  pointer pMVar51;
  pointer ppMVar52;
  size_t __n;
  uint uVar53;
  size_t sVar54;
  TestStatus *pTVar55;
  VkDeviceSize total;
  bool bVar56;
  float fVar57;
  vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_> ranges;
  pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long> val;
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  nonEmptyHeaps;
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  nonFullHeaps;
  MemoryObject_conflict *object_1;
  undefined1 local_f8 [24];
  VkAllocationCallbacks *pVStack_e0;
  Move<vk::Handle<(vk::HandleType)7>_> local_d8;
  DeviceInterface *local_b8;
  ulong local_b0;
  RandomMemoryMappingInstance *local_a8;
  VkDevice local_a0;
  deRandom *local_98;
  undefined1 *local_90;
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  local_88;
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  local_68;
  TestStatus *local_48;
  value_type local_40;
  value_type local_38;
  
  pVVar31 = Context::getDevice((this->super_TestInstance).m_context);
  pDVar32 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  if ((this->m_memoryLimits).totalDeviceLocalMemory == 0) {
    lVar49 = 0;
    VVar46 = 0;
    do {
      VVar46 = VVar46 + (this->m_totalMemTracker).m_usage[lVar49];
      lVar49 = lVar49 + 1;
    } while (lVar49 == 1);
  }
  else {
    VVar46 = (this->m_totalMemTracker).m_usage[0];
  }
  local_a8 = this;
  local_48 = __return_storage_ptr__;
  if ((this->m_memoryMappings).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_memoryMappings).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pRVar1 = &this->m_rng;
    fVar57 = deRandom_getFloat(&pRVar1->m_rnd);
    if (fVar57 < 0.5) {
      ppMVar39 = (this->m_memoryMappings).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar7 = (this->m_memoryMappings).
                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppMVar39 == ppMVar7) {
        pMVar37 = (MemoryMapping *)0x0;
      }
      else {
        uVar53 = 1;
        pMVar37 = (MemoryMapping *)0x0;
        do {
          if (((int)(uVar53 - 1) < 1) ||
             (dVar27 = deRandom_getUint32(&pRVar1->m_rnd), (int)(dVar27 % uVar53) < 1)) {
            pMVar37 = *ppMVar39;
          }
          ppMVar39 = ppMVar39 + 1;
          uVar53 = uVar53 + 1;
        } while (ppMVar39 != ppMVar7);
      }
      dVar27 = deRandom_getUint32(&pRVar1->m_rnd);
      dVar29 = deRandom_getUint32(&pRVar1->m_rnd);
      uVar41 = (ulong)(dVar29 % 0x65);
      if (dVar27 % 3 == 2) {
        if (uVar41 != 0) {
          uVar45 = 0;
          do {
            dVar27 = deRandom_getUint32(&pRVar1->m_rnd);
            dVar29 = deRandom_getUint32(&pRVar1->m_rnd);
            uVar42 = CONCAT44(dVar27,dVar29) % (pMVar37->m_range).size;
            bVar19 = *(byte *)((long)pMVar37->m_ptr + uVar42);
            dVar27 = deRandom_getUint32(&pRVar1->m_rnd);
            bVar26 = (byte)dVar27 ^ bVar19;
            *(byte *)((long)pMVar37->m_ptr + uVar42) = bVar26;
            pRVar9 = pMVar37->m_reference;
            uVar42 = uVar42 + (pMVar37->m_range).offset;
            if (((pRVar9->m_defined).m_data.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar42 >> 5] >> ((uint)uVar42 & 0x1f) & 1) == 0) {
              bVar56 = true;
            }
            else {
              bVar56 = (pRVar9->m_bytes).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar42] == bVar19;
            }
            (pRVar9->m_bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar42] = bVar26;
            puVar4 = (pRVar9->m_defined).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + (uVar42 >> 5);
            *puVar4 = *puVar4 | 1 << ((byte)uVar42 & 0x1f);
            auVar16._8_8_ = 0;
            auVar16._0_8_ = pRVar9->m_atomSize;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = uVar42;
            bVar19 = SUB161(auVar18 / auVar16,0) & 0x1f;
            puVar4 = (pRVar9->m_flushed).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + (SUB168(auVar18 / auVar16,0) >> 5);
            *puVar4 = *puVar4 & (-2 << bVar19 | 0xfffffffeU >> 0x20 - bVar19);
            if (!bVar56) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,(char *)0x0,
                         "m_reference.modifyXor((size_t)(m_range.offset + pos), val, mask)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                         ,0x273);
              goto LAB_00681ad1;
            }
            uVar45 = uVar45 + 1;
          } while (uVar45 < uVar41);
        }
      }
      else if (dVar27 % 3 == 1) {
        if (uVar41 != 0) {
          uVar45 = 0;
          do {
            dVar27 = deRandom_getUint32(&pRVar1->m_rnd);
            dVar29 = deRandom_getUint32(&pRVar1->m_rnd);
            uVar42 = CONCAT44(dVar27,dVar29) % (pMVar37->m_range).size;
            dVar27 = deRandom_getUint32(&pRVar1->m_rnd);
            *(uchar *)((long)pMVar37->m_ptr + uVar42) = (uchar)dVar27;
            pRVar9 = pMVar37->m_reference;
            uVar42 = uVar42 + (pMVar37->m_range).offset;
            (pRVar9->m_bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar42] = (uchar)dVar27;
            puVar4 = (pRVar9->m_defined).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + (uVar42 >> 5);
            *puVar4 = *puVar4 | 1 << ((byte)uVar42 & 0x1f);
            auVar14._8_4_ = 0;
            auVar14._0_8_ = pRVar9->m_atomSize;
            auVar20._8_4_ = 0;
            auVar20._0_8_ = uVar42;
            bVar19 = SUB121(auVar20 / auVar14,0) & 0x1f;
            puVar4 = (pRVar9->m_flushed).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + (SUB128(auVar20 / auVar14,0) >> 5);
            *puVar4 = *puVar4 & (-2 << bVar19 | 0xfffffffeU >> 0x20 - bVar19);
            uVar45 = uVar45 + 1;
          } while (uVar45 < uVar41);
        }
      }
      else if (uVar41 != 0) {
        uVar45 = 0;
        do {
          dVar27 = deRandom_getUint32(&pRVar1->m_rnd);
          dVar29 = deRandom_getUint32(&pRVar1->m_rnd);
          uVar42 = CONCAT44(dVar27,dVar29) % (pMVar37->m_range).size;
          uVar5 = *(uchar *)((long)pMVar37->m_ptr + uVar42);
          uVar42 = uVar42 + (pMVar37->m_range).offset;
          pRVar9 = pMVar37->m_reference;
          uVar43 = uVar42 >> 5;
          puVar12 = (pRVar9->m_bytes).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar53 = 1 << ((byte)uVar42 & 0x1f);
          if (((pRVar9->m_defined).m_data.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar43] >> ((uint)uVar42 & 0x1f) & 1) == 0) {
            puVar12[uVar42] = uVar5;
            puVar4 = (pRVar9->m_defined).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar43;
            *puVar4 = *puVar4 | uVar53;
          }
          else {
            uVar6 = puVar12[uVar42];
            puVar12[uVar42] = uVar5;
            puVar4 = (pRVar9->m_defined).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar43;
            *puVar4 = *puVar4 | uVar53;
            if (uVar6 != uVar5) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,(char *)0x0,"m_reference.read((size_t)(m_range.offset + pos), val)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                         ,0x256);
              goto LAB_00681ad1;
            }
          }
          uVar45 = uVar45 + 1;
        } while (uVar45 < uVar41);
      }
      goto LAB_0068189b;
    }
  }
  local_b8 = pDVar32;
  if ((this->m_mappedMemoryObjects).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_mappedMemoryObjects).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0068090e:
    if ((this->m_mappedMemoryObjects).
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_mappedMemoryObjects).
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      fVar57 = deRandom_getFloat(&(this->m_rng).m_rnd);
      if (fVar57 < 0.25) {
        pMVar33 = de::Random::
                  choose<vkt::memory::(anonymous_namespace)::MemoryObject*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject**,std::vector<vkt::memory::(anonymous_namespace)::MemoryObject*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject*>>>>
                            (&this->m_rng,
                             (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                              )(this->m_mappedMemoryObjects).
                               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                             (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                              )(this->m_mappedMemoryObjects).
                               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
        ppMVar39 = (this->m_memoryMappings).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppMVar7 = (this->m_memoryMappings).
                  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar49 = (long)ppMVar7 - (long)ppMVar39;
        if (lVar49 != 0) {
          lVar49 = lVar49 >> 3;
          lVar48 = 0;
          do {
            if (ppMVar39[lVar48] == pMVar33->m_mapping) {
              ppMVar39[lVar48] = ppMVar7[-1];
              pppMVar2 = &(this->m_memoryMappings).
                          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppMVar2 = *pppMVar2 + -1;
              break;
            }
            lVar48 = lVar48 + 1;
          } while (lVar49 + (ulong)(lVar49 == 0) != lVar48);
        }
        local_f8._0_8_ = pMVar33;
        (*pMVar33->m_vkd->_vptr_DeviceInterface[8])
                  (pMVar33->m_vkd,pMVar33->m_device,
                   (pMVar33->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                   m_internal);
        if (pMVar33->m_mapping != (MemoryMapping *)0x0) {
          operator_delete(pMVar33->m_mapping,0x20);
        }
        pMVar33->m_mapping = (MemoryMapping *)0x0;
        ppMVar52 = (this->m_mappedMemoryObjects).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppMVar13 = (this->m_mappedMemoryObjects).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        lVar49 = (long)ppMVar13 - (long)ppMVar52;
        if (lVar49 != 0) {
          lVar49 = lVar49 >> 3;
          lVar48 = 0;
          do {
            if (ppMVar52[lVar48] == pMVar33) {
              ppMVar52[lVar48] = ppMVar13[-1];
              pppMVar3 = &(this->m_mappedMemoryObjects).
                          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppMVar3 = *pppMVar3 + -1;
              break;
            }
            lVar48 = lVar48 + 1;
          } while (lVar49 + (ulong)(lVar49 == 0) != lVar48);
        }
        std::
        vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
        ::push_back(&this->m_nonMappedMemoryObjects,(value_type *)local_f8);
        (this->m_totalMemTracker).m_usage[0] =
             (this->m_totalMemTracker).m_usage[0] - this->m_memoryMappingSysMemSize;
        goto LAB_0068189b;
      }
    }
    local_a0 = pVVar31;
    if ((this->m_nonMappedMemoryObjects).
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_nonMappedMemoryObjects).
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pRVar1 = &this->m_rng;
      fVar57 = deRandom_getFloat(&pRVar1->m_rnd);
      if ((fVar57 < 0.5) &&
         (this->m_memoryMappingSysMemSize + VVar46 <= (this->m_memoryLimits).totalSystemMemory)) {
        pMVar33 = de::Random::
                  choose<vkt::memory::(anonymous_namespace)::MemoryObject*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject**,std::vector<vkt::memory::(anonymous_namespace)::MemoryObject*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject*>>>>
                            (pRVar1,(__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                                     )(this->m_nonMappedMemoryObjects).
                                      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                             (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                              )(this->m_nonMappedMemoryObjects).
                               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
        local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
             (deUint64)pMVar33;
        VVar46 = randomSize(pRVar1,pMVar33->m_atomSize,pMVar33->m_size);
        VVar40 = randomOffset(pRVar1,pMVar33->m_atomSize,pMVar33->m_size - VVar46);
        VVar30 = (*local_b8->_vptr_DeviceInterface[7])
                           (local_b8,local_a0,
                            (pMVar33->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data
                            .object.m_internal,VVar40,VVar46,0,local_f8);
        ::vk::checkResult(VVar30,"vkd.mapMemory(device, *m_memory, offset, size, 0u, &ptr)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                          ,0x2ea);
        uVar22 = local_f8._0_8_;
        if ((MemoryObject_conflict *)local_f8._0_8_ == (MemoryObject_conflict *)0x0) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,(char *)0x0,"ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                     ,0x2eb);
LAB_00681ad1:
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pMVar37 = (MemoryMapping *)operator_new(0x20);
        (pMVar37->m_range).offset = VVar40;
        (pMVar37->m_range).size = VVar46;
        pMVar37->m_ptr = (void *)uVar22;
        pMVar37->m_reference = &pMVar33->m_referenceMemory;
        pMVar33->m_mapping = pMVar37;
        ppMVar39 = (this->m_memoryMappings).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (ppMVar39 ==
            (this->m_memoryMappings).
            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ppMVar7 = (this->m_memoryMappings).
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          __n = (long)ppMVar39 - (long)ppMVar7;
          if (__n == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar45 = (long)__n >> 3;
          uVar41 = 1;
          if (ppMVar39 != ppMVar7) {
            uVar41 = uVar45;
          }
          uVar42 = uVar41 + uVar45;
          if (0xffffffffffffffe < uVar42) {
            uVar42 = 0xfffffffffffffff;
          }
          if (CARRY8(uVar41,uVar45)) {
            uVar42 = 0xfffffffffffffff;
          }
          if (uVar42 == 0) {
            ppMVar39 = (pointer)0x0;
          }
          else {
            ppMVar39 = (pointer)operator_new(uVar42 * 8);
          }
          ppMVar39[uVar45] = pMVar37;
          if (0 < (long)__n) {
            memmove(ppMVar39,ppMVar7,__n);
          }
          this = local_a8;
          if (ppMVar7 != (pointer)0x0) {
            operator_delete(ppMVar7,(long)(local_a8->m_memoryMappings).
                                          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)ppMVar7);
          }
          (this->m_memoryMappings).
          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
          ._M_impl.super__Vector_impl_data._M_start = ppMVar39;
          (this->m_memoryMappings).
          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(__n + 8 + (long)ppMVar39);
          (this->m_memoryMappings).
          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = ppMVar39 + uVar42;
        }
        else {
          *ppMVar39 = pMVar37;
          pppMVar2 = &(this->m_memoryMappings).
                      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppMVar2 = *pppMVar2 + 1;
        }
        std::
        vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
        ::push_back(&this->m_mappedMemoryObjects,(value_type *)&local_d8);
        ppMVar52 = (this->m_nonMappedMemoryObjects).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppMVar13 = (this->m_nonMappedMemoryObjects).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        lVar49 = (long)ppMVar13 - (long)ppMVar52;
        if (lVar49 != 0) {
          lVar49 = lVar49 >> 3;
          lVar48 = 0;
          do {
            if (ppMVar52[lVar48] == pMVar33) {
              ppMVar52[lVar48] = ppMVar13[-1];
              pppMVar3 = &(this->m_nonMappedMemoryObjects).
                          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppMVar3 = *pppMVar3 + -1;
              break;
            }
            lVar48 = lVar48 + 1;
          } while (lVar49 + (ulong)(lVar49 == 0) != lVar48);
        }
        (this->m_totalMemTracker).m_usage[0] =
             (this->m_totalMemTracker).m_usage[0] + this->m_memoryMappingSysMemSize;
        goto LAB_0068189b;
      }
    }
    local_68.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (MemoryHeap **)0x0;
    local_68.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (MemoryHeap **)0x0;
    local_68.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (MemoryHeap **)0x0;
    local_88.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (MemoryHeap **)0x0;
    if ((this->m_memoryLimits).totalSystemMemory < VVar46 + this->m_memoryObjectSysMemSize) {
      pSVar44 = (this->m_memoryHeaps).
                super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pSVar44 !=
          (this->m_memoryHeaps).
          super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pMVar33 = (MemoryObject_conflict *)pSVar44->m_ptr;
          if (((pMVar33->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
               m_device != (VkDevice)0x0) ||
             (bVar56 = MemoryHeap::full((MemoryHeap *)pMVar33), bVar56)) {
            local_f8._0_8_ = pMVar33;
            std::
            vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
            ::push_back(&local_88,(value_type *)local_f8);
          }
          pSVar44 = pSVar44 + 1;
        } while (pSVar44 !=
                 (this->m_memoryHeaps).
                 super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
      (this->m_totalMemTracker).m_usage[0] =
           (this->m_totalMemTracker).m_usage[0] + this->m_memoryObjectSysMemSize;
      pSVar44 = (this->m_memoryHeaps).
                super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pSVar44 !=
          (this->m_memoryHeaps).
          super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pMVar33 = (MemoryObject_conflict *)pSVar44->m_ptr;
          bVar56 = MemoryHeap::full((MemoryHeap *)pMVar33);
          if (!bVar56) {
            local_f8._0_8_ = pMVar33;
            std::
            vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
            ::push_back(&local_68,(value_type *)local_f8);
          }
          pMVar33 = (MemoryObject_conflict *)pSVar44->m_ptr;
          if (((pMVar33->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
               m_device != (VkDevice)0x0) ||
             (bVar56 = MemoryHeap::full((MemoryHeap *)pMVar33), bVar56)) {
            local_f8._0_8_ = pMVar33;
            std::
            vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
            ::push_back(&local_88,(value_type *)local_f8);
          }
          pSVar44 = pSVar44 + 1;
        } while (pSVar44 !=
                 (local_a8->m_memoryHeaps).
                 super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      (local_a8->m_totalMemTracker).m_usage[0] =
           (local_a8->m_totalMemTracker).m_usage[0] - local_a8->m_memoryObjectSysMemSize;
      this = local_a8;
    }
    last = local_68.
           super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    first = local_68.
            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if ((local_68.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         local_68.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((local_88.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_88.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
         ._M_impl.super__Vector_impl_data._M_finish &&
        (fVar57 = deRandom_getFloat(&(this->m_rng).m_rnd), 0.75 <= fVar57)))) {
      pMVar34 = de::Random::
                choose<vkt::memory::(anonymous_namespace)::MemoryHeap*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap**,std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap*>>>>
                          (&this->m_rng,
                           (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>_>
                            )local_88.
                             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>_>
                            )local_88.
                             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
      ppMVar52 = (pMVar34->m_objects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar13 = (pMVar34->m_objects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppMVar52 == ppMVar13) {
        pMVar33 = (MemoryObject_conflict *)0x0;
      }
      else {
        uVar53 = 1;
        pMVar33 = (MemoryObject_conflict *)0x0;
        do {
          if (((int)(uVar53 - 1) < 1) ||
             (dVar27 = deRandom_getUint32(&(this->m_rng).m_rnd), (int)(dVar27 % uVar53) < 1)) {
            pMVar33 = *ppMVar52;
          }
          ppMVar52 = ppMVar52 + 1;
          uVar53 = uVar53 + 1;
        } while (ppMVar52 != ppMVar13);
      }
      pRVar25 = local_a8;
      if (pMVar33->m_mapping != (MemoryMapping *)0x0) {
        ppMVar39 = (local_a8->m_memoryMappings).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppMVar7 = (local_a8->m_memoryMappings).
                  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar49 = (long)ppMVar7 - (long)ppMVar39;
        if (lVar49 != 0) {
          lVar49 = lVar49 >> 3;
          lVar48 = 0;
          do {
            if (ppMVar39[lVar48] == pMVar33->m_mapping) {
              ppMVar39[lVar48] = ppMVar7[-1];
              pppMVar2 = &(local_a8->m_memoryMappings).
                          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppMVar2 = *pppMVar2 + -1;
              break;
            }
            lVar48 = lVar48 + 1;
          } while (lVar49 + (ulong)(lVar49 == 0) != lVar48);
        }
        (local_a8->m_totalMemTracker).m_usage[0] =
             (local_a8->m_totalMemTracker).m_usage[0] - local_a8->m_memoryMappingSysMemSize;
      }
      ppMVar52 = (local_a8->m_mappedMemoryObjects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar13 = (local_a8->m_mappedMemoryObjects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar49 = (long)ppMVar13 - (long)ppMVar52;
      if (lVar49 != 0) {
        lVar49 = lVar49 >> 3;
        lVar48 = 0;
        do {
          if (ppMVar52[lVar48] == pMVar33) {
            ppMVar52[lVar48] = ppMVar13[-1];
            pppMVar3 = &(local_a8->m_mappedMemoryObjects).
                        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppMVar3 = *pppMVar3 + -1;
            break;
          }
          lVar48 = lVar48 + 1;
        } while (lVar49 + (ulong)(lVar49 == 0) != lVar48);
      }
      ppMVar52 = (local_a8->m_nonMappedMemoryObjects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar13 = (local_a8->m_nonMappedMemoryObjects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar49 = (long)ppMVar13 - (long)ppMVar52;
      if (lVar49 != 0) {
        lVar49 = lVar49 >> 3;
        lVar48 = 0;
        do {
          if (ppMVar52[lVar48] == pMVar33) {
            ppMVar52[lVar48] = ppMVar13[-1];
            pppMVar3 = &(local_a8->m_nonMappedMemoryObjects).
                        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppMVar3 = *pppMVar3 + -1;
            break;
          }
          lVar48 = lVar48 + 1;
        } while (lVar49 + (ulong)(lVar49 == 0) != lVar48);
      }
      ppMVar52 = (pMVar34->m_objects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppMVar13 = (pMVar34->m_objects).
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar49 = (long)ppMVar13 - (long)ppMVar52;
      if (lVar49 != 0) {
        lVar49 = lVar49 >> 3;
        lVar48 = 0;
        do {
          if (ppMVar52[lVar48] == pMVar33) {
            ppMVar52[lVar48] = ppMVar13[-1];
            pppMVar3 = &(pMVar34->m_objects).
                        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppMVar3 = *pppMVar3 + -1;
            break;
          }
          lVar48 = lVar48 + 1;
        } while (lVar49 + (ulong)(lVar49 == 0) != lVar48);
      }
      pMVar34->m_usage = pMVar34->m_usage - pMVar33->m_memoryUsage;
      pTVar8 = pMVar34->m_totalMemTracker;
      pTVar8->m_usage[0] = pTVar8->m_usage[0] - pMVar33->m_referenceMemoryUsage;
      pTVar8->m_usage[(pMVar34->m_heap).flags & 1] =
           pTVar8->m_usage[(pMVar34->m_heap).flags & 1] - pMVar33->m_memoryUsage;
      if (pMVar33 != (MemoryObject_conflict *)0x0) {
        MemoryObject::~MemoryObject((MemoryObject *)pMVar33);
        operator_delete(pMVar33,0xb0);
      }
      pTVar8 = &pRVar25->m_totalMemTracker;
      pTVar8->m_usage[0] = pTVar8->m_usage[0] - pRVar25->m_memoryObjectSysMemSize;
    }
    else {
      (this->m_totalMemTracker).m_usage[0] =
           (this->m_totalMemTracker).m_usage[0] + this->m_memoryObjectSysMemSize;
      local_98 = &(this->m_rng).m_rnd;
      pMVar34 = de::Random::
                choose<vkt::memory::(anonymous_namespace)::MemoryHeap*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap**,std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap*>>>>
                          ((Random *)local_98,
                           (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>_>
                            )first,(__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>_>
                                    )last);
      local_f8._0_8_ = (value_type)0x0;
      local_f8._8_8_ = (value_type)0x0;
      local_f8._16_8_ = (pointer)0x0;
      pMVar35 = (pMVar34->m_memoryTypes).
                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pMVar34->m_memoryTypes).
          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
          ._M_impl.super__Vector_impl_data._M_finish != pMVar35) {
        local_b0 = ((pMVar34->m_heap).size >> 1) - pMVar34->m_usage;
        local_90 = (undefined1 *)pMVar34->m_limits->totalDeviceLocalMemory;
        uVar53 = (pMVar34->m_heap).flags & 1;
        uVar41 = 0;
        do {
          uVar47 = pMVar35[uVar41].type.propertyFlags;
          VVar46 = 1;
          if ((uVar47 & 4) == 0) {
            VVar46 = pMVar34->m_nonCoherentAtomSize;
          }
          if (uVar53 == 0) {
            VVar40 = 0x1000;
          }
          else {
            VVar40 = pMVar34->m_limits->devicePageSize;
          }
          dVar27 = pMVar35[uVar41].type.heapIndex;
          if (VVar40 < VVar46) {
            VVar40 = VVar46;
          }
          uVar45 = VVar46 * 8;
          uVar42 = ((((VVar40 >> 3) + VVar40 + VVar40 / uVar45) - (ulong)(VVar40 % uVar45 == 0)) + 2
                   ) - (ulong)((VVar40 & 7) == 0);
          pTVar8 = pMVar34->m_totalMemTracker;
          if (local_90 == (undefined1 *)0x0) {
            lVar49 = 0;
            lVar48 = 0;
            do {
              lVar48 = lVar48 + pTVar8->m_usage[lVar49];
              lVar49 = lVar49 + 1;
            } while (lVar49 == 1);
            uVar43 = pMVar34->m_limits->totalSystemMemory - lVar48;
            if ((uVar42 + VVar40 <= uVar43) && (VVar40 <= local_b0)) {
              uVar45 = (uVar43 * uVar45) / (VVar46 * 0x11 + 1);
              local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
                   (VkDevice)(uVar45 - uVar45 % VVar40);
              local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._4_4_
                   = uVar47;
              local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._0_4_
                   = pMVar35[uVar41].index;
              local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
                   (DeviceInterface *)
                   CONCAT44(local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                            m_deviceIface._4_4_,dVar27);
              std::
              vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
              ::push_back((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
                           *)local_f8,(value_type *)&local_d8);
            }
          }
          else {
            lVar49 = 0;
            lVar48 = 0;
            do {
              lVar48 = lVar48 + pTVar8->m_usage[lVar49];
              lVar49 = lVar49 + 1;
            } while (lVar49 == 1);
            sVar38 = pMVar34->m_limits->totalSystemMemory;
            sVar54 = sVar38;
            if (uVar53 != 0) {
              sVar54 = pMVar34->m_limits->totalDeviceLocalMemory;
            }
            uVar43 = sVar38 - lVar48;
            if (((uVar42 <= uVar43) && (VVar40 <= local_b0)) &&
               (uVar42 = sVar54 - pTVar8->m_usage[uVar53], VVar40 <= uVar42)) {
              uVar45 = (uVar43 * uVar45) / (VVar46 * 9 + 1);
              if (uVar42 < uVar45) {
                uVar45 = uVar42;
              }
              local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
                   (VkDevice)(uVar45 - uVar45 % VVar40);
              local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._4_4_
                   = uVar47;
              local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._0_4_
                   = pMVar35[uVar41].index;
              local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
                   (DeviceInterface *)
                   CONCAT44(local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                            m_deviceIface._4_4_,dVar27);
              std::
              vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
              ::push_back((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
                           *)local_f8,(value_type *)&local_d8);
            }
          }
          uVar41 = uVar41 + 1;
          pMVar35 = (pMVar34->m_memoryTypes).
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar41 < (ulong)(((long)(pMVar34->m_memoryTypes).
                                         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar35
                                  >> 2) * -0x5555555555555555));
      }
      uVar23 = local_f8._8_8_;
      uVar22 = local_f8._0_8_;
      local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._0_4_ =
           0xffffffff;
      local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x0
      ;
      if (local_f8._0_8_ != local_f8._8_8_) {
        uVar53 = 0;
        pMVar36 = (value_type)local_f8._0_8_;
        do {
          uVar47 = uVar53;
          if ((int)uVar53 < 1) {
LAB_00680d89:
            lVar49 = (long)(int)uVar47;
            *(undefined4 *)
             &(&local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter)[lVar49].
              m_deviceIface = *(undefined4 *)&pMVar36->m_device;
            (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object)[lVar49 * 3].
            m_internal = ((VkMemoryHeap *)&pMVar36->m_vkd)->size;
            (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter)[lVar49].
            m_device = (VkDevice)
                       (((vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                          *)&pMVar36->m_memoryTypeIndex)->
                       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                       )._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            dVar27 = deRandom_getUint32(local_98);
            uVar47 = dVar27 % (uVar53 + 1);
            if ((int)uVar47 < 1) goto LAB_00680d89;
          }
          pMVar36 = (value_type)&pMVar36->m_size;
          uVar53 = uVar53 + 1;
        } while (pMVar36 != (value_type)uVar23);
      }
      pVVar31 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
      HVar24.m_internal =
           local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
      local_b0 = CONCAT44(local_b0._4_4_,
                          (deUint32)
                          local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                          m_internal);
      if ((value_type)uVar22 != (value_type)0x0) {
        operator_delete((void *)uVar22,local_f8._16_8_ - uVar22);
      }
      local_90 = &DAT_00000001;
      if ((HVar24.m_internal & 0x400000000) == 0) {
        local_90 = (undefined1 *)pMVar34->m_nonCoherentAtomSize;
      }
      puVar50 = (undefined1 *)0x1000;
      if (((pMVar34->m_heap).flags & 1) != 0) {
        puVar50 = (undefined1 *)pMVar34->m_limits->devicePageSize;
      }
      VVar46 = randomSize((Random *)local_98,(VkDeviceSize)local_90,(ulong)pVVar31 >> 1);
      if (puVar50 < local_90) {
        puVar50 = local_90;
      }
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_90;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = VVar46;
      local_98 = SUB168(auVar17 / auVar15,0);
      uVar41 = ((((VVar46 >> 3) + VVar46) - (ulong)((VVar46 & 7) == 0)) + ((ulong)local_98 >> 3) + 2
               ) - (ulong)((auVar17 / auVar15 & (undefined1  [16])0x7) == (undefined1  [16])0x0);
      pMVar36 = (value_type)operator_new(0xb0);
      pDVar32 = (DeviceInterface *)
                (((VVar46 / (ulong)puVar50 + 1) - (ulong)(VVar46 % (ulong)puVar50 == 0)) *
                (long)puVar50);
      pMVar36->m_vkd = local_b8;
      pMVar36->m_device = local_a0;
      pMVar36->m_memoryTypeIndex = (deUint32)local_b0;
      pMVar36->m_size = VVar46;
      pMVar36->m_atomSize = (VkDeviceSize)local_90;
      pMVar36->m_memoryUsage = (VkDeviceSize)pDVar32;
      pMVar36->m_referenceMemoryUsage = uVar41;
      (pMVar36->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0
      ;
      (pMVar36->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface
           = (DeviceInterface *)0x0;
      (pMVar36->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      (pMVar36->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      pMVar36->m_mapping = (MemoryMapping *)0x0;
      (pMVar36->m_referenceMemory).m_atomSize = (size_t)local_90;
      local_f8[0] = 0xde;
      local_b8 = pDVar32;
      local_b0 = uVar41;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&(pMVar36->m_referenceMemory).m_bytes,VVar46,local_f8,(allocator_type *)&local_d8);
      local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&(pMVar36->m_referenceMemory).m_defined.m_data,
                 ((VVar46 >> 5) + 1) - (ulong)((VVar46 & 0x1f) == 0),
                 (value_type_conflict2 *)local_f8,(allocator_type *)&local_d8);
      local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&(pMVar36->m_referenceMemory).m_flushed.m_data,
                 (((ulong)local_98 >> 5) + 1) - (ulong)(((ulong)local_98 & 0x1f) == 0),
                 (value_type_conflict2 *)local_f8,(allocator_type *)&local_d8);
      local_f8._16_8_ = pMVar36->m_size;
      local_f8._0_4_ = 5;
      local_f8._8_8_ = (pointer)0x0;
      pVStack_e0 = (VkAllocationCallbacks *)CONCAT44(pVStack_e0._4_4_,pMVar36->m_memoryTypeIndex);
      ::vk::allocateMemory
                (&local_d8,pMVar36->m_vkd,pMVar36->m_device,(VkMemoryAllocateInfo *)local_f8,
                 (VkAllocationCallbacks *)0x0);
      uVar41 = local_b0;
      pDVar32 = local_b8;
      local_f8._16_8_ =
           local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
      pVStack_e0 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator
      ;
      local_f8._0_8_ =
           local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
      local_f8._8_8_ =
           local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
      local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
      local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x0
      ;
      local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      obj.m_internal =
           (pMVar36->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
           m_internal;
      if (obj.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                  (&(pMVar36->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter
                   ,obj);
      }
      (pMVar36->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
           (VkDevice)local_f8._16_8_;
      (pMVar36->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
           pVStack_e0;
      (pMVar36->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
           local_f8._0_8_;
      (pMVar36->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface
           = (DeviceInterface *)local_f8._8_8_;
      if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                  (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
                   (VkDeviceMemory)
                   local_d8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal);
      }
      pMVar34->m_usage = (long)&pDVar32->_vptr_DeviceInterface + pMVar34->m_usage;
      pTVar8 = pMVar34->m_totalMemTracker;
      pTVar8->m_usage[(pMVar34->m_heap).flags & 1] =
           (long)&pDVar32->_vptr_DeviceInterface + pTVar8->m_usage[(pMVar34->m_heap).flags & 1];
      pTVar8->m_usage[0] = pTVar8->m_usage[0] + uVar41;
      local_38 = pMVar36;
      std::
      vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ::push_back(&pMVar34->m_objects,&local_38);
      local_40 = pMVar36;
      std::
      vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ::push_back(&local_a8->m_nonMappedMemoryObjects,&local_40);
    }
    pMVar33 = (MemoryObject_conflict *)
              local_68.
              super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pVVar21 = (pointer)local_68.
                       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_88.
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (MemoryHeap **)0x0) {
      operator_delete(local_88.
                      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      pMVar33 = (MemoryObject_conflict *)
                local_68.
                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar21 = (pointer)local_68.
                         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  else {
    pRVar1 = &this->m_rng;
    fVar57 = deRandom_getFloat(&pRVar1->m_rnd);
    if (0.4 <= fVar57) goto LAB_0068090e;
    local_a0 = pVVar31;
    pMVar33 = de::Random::
              choose<vkt::memory::(anonymous_namespace)::MemoryObject*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject**,std::vector<vkt::memory::(anonymous_namespace)::MemoryObject*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject*>>>>
                        (pRVar1,(__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                                 )(this->m_mappedMemoryObjects).
                                  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                          )(this->m_mappedMemoryObjects).
                           super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
    dVar28 = deRandom_getBool(&pRVar1->m_rnd);
    dVar27 = deRandom_getUint32(&pRVar1->m_rnd);
    uVar41 = (ulong)(dVar27 % 10 + 1);
    if (dVar28 == 1) {
      std::vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>::vector
                ((vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_> *)
                 local_f8,uVar41,(allocator_type *)&local_d8);
      randomRanges(pRVar1,(vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>
                           *)local_f8,uVar41,
                   (VkDeviceMemory)
                   (pMVar33->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                   m_internal,(pMVar33->m_mapping->m_range).offset,
                   (pMVar33->m_mapping->m_range).size,pMVar33->m_atomSize);
      if (local_f8._8_8_ == local_f8._0_8_) {
        uVar41 = 0;
      }
      else {
        lVar49 = 0x20;
        uVar45 = 0;
        do {
          uVar41 = (pMVar33->m_referenceMemory).m_atomSize;
          BitVector::setRange(&(pMVar33->m_referenceMemory).m_flushed,
                              *(ulong *)(local_f8._0_8_ + lVar49 + -8) / uVar41,
                              *(ulong *)((long)&((VkMemoryHeap *)local_f8._0_8_)->size + lVar49) /
                              uVar41,true);
          uVar45 = uVar45 + 1;
          uVar41 = ((long)(local_f8._8_8_ - local_f8._0_8_) >> 3) * -0x3333333333333333;
          lVar49 = lVar49 + 0x28;
        } while (uVar45 < uVar41);
      }
      pMVar33 = (MemoryObject_conflict *)0x0;
      if (local_f8._0_8_ != local_f8._8_8_) {
        pMVar33 = (MemoryObject_conflict *)local_f8._0_8_;
      }
      VVar30 = (*local_b8->_vptr_DeviceInterface[9])(local_b8,local_a0,uVar41,pMVar33);
      ::vk::checkResult(VVar30,
                        "vkd.flushMappedMemoryRanges(device, (deUint32)ranges.size(), ranges.empty() ? DE_NULL : &ranges[0])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                        ,0x303);
      pMVar33 = (MemoryObject_conflict *)local_f8._0_8_;
      pVVar21 = (pointer)local_f8._16_8_;
    }
    else {
      std::vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>::vector
                ((vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_> *)
                 local_f8,uVar41,(allocator_type *)&local_d8);
      randomRanges(pRVar1,(vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>
                           *)local_f8,uVar41,
                   (VkDeviceMemory)
                   (pMVar33->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                   m_internal,(pMVar33->m_mapping->m_range).offset,
                   (pMVar33->m_mapping->m_range).size,pMVar33->m_atomSize);
      if (local_f8._8_8_ == local_f8._0_8_) {
        uVar41 = 0;
      }
      else {
        uVar45 = 0;
        do {
          pMVar35 = ((pointer *)(local_f8._0_8_ + 0x18))[uVar45 * 5];
          pMVar51 = ((pointer *)(local_f8._0_8_ + 0x20))[uVar45 * 5];
          count = (pointer)(pMVar33->m_referenceMemory).m_atomSize;
          if (count == (pointer)&DAT_00000001) {
            pMVar51 = (pointer)((long)&pMVar51->index + (long)pMVar35);
            if (((ulong)pMVar35 & 0x1f) != 0 && pMVar35 < pMVar51) {
              puVar10 = (pMVar33->m_referenceMemory).m_defined.m_data.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar11 = (pMVar33->m_referenceMemory).m_flushed.m_data.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar53 = (uint)pMVar35 & 0x1f;
              do {
                uVar41 = (ulong)pMVar35 >> 5;
                uVar47 = 1 << ((byte)uVar53 & 0x1f);
                if (((puVar11[uVar41] >> (uVar53 & 0x1f) & 1) == 0) ||
                   ((puVar10[uVar41] & uVar47) == 0)) {
                  puVar10[uVar41] = puVar10[uVar41] & ~uVar47;
                }
                else {
                  puVar10[uVar41] = puVar10[uVar41] | uVar47;
                }
                pMVar35 = (pointer)((long)&pMVar35->index + 1);
              } while ((pMVar35 < pMVar51) && (uVar53 = uVar53 + 1, ((ulong)pMVar35 & 0x1f) != 0));
            }
            if (pMVar35 < (pointer)((ulong)pMVar51 & 0xffffffffffffffe0)) {
              puVar10 = (pMVar33->m_referenceMemory).m_defined.m_data.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar11 = (pMVar33->m_referenceMemory).m_flushed.m_data.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar41 = (ulong)pMVar35 >> 3 & 0xfffffffffffffffc;
              do {
                puVar4 = (uint *)((long)puVar10 + uVar41);
                *puVar4 = *puVar4 & *(uint *)((long)puVar11 + uVar41);
                pMVar35 = (pointer)&pMVar35[2].type.heapIndex;
                uVar41 = uVar41 + 4;
              } while (pMVar35 < (pointer)((ulong)pMVar51 & 0xffffffffffffffe0));
            }
            if (pMVar35 < pMVar51) {
              puVar10 = (pMVar33->m_referenceMemory).m_defined.m_data.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar11 = (pMVar33->m_referenceMemory).m_flushed.m_data.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                uVar41 = (ulong)pMVar35 >> 5;
                uVar53 = 1 << ((byte)pMVar35 & 0x1f);
                if (((puVar11[uVar41] >> ((uint)pMVar35 & 0x1f) & 1) == 0) ||
                   ((puVar10[uVar41] & uVar53) == 0)) {
                  puVar10[uVar41] = puVar10[uVar41] & ~uVar53;
                }
                else {
                  puVar10[uVar41] = puVar10[uVar41] | uVar53;
                }
                pMVar35 = (pointer)((long)&pMVar35->index + 1);
              } while (pMVar35 < pMVar51);
            }
          }
          else if (count <= pMVar51) {
            uVar41 = 0;
            do {
              uVar42 = (ulong)pMVar35 / (ulong)count + uVar41;
              if (((pMVar33->m_referenceMemory).m_flushed.m_data.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar42 >> 5] >> ((uint)uVar42 & 0x1f) & 1) == 0)
              {
                BitVector::setRange(&(pMVar33->m_referenceMemory).m_defined,
                                    (size_t)((long)&pMVar35->index + uVar41 * (long)count),
                                    (size_t)count,false);
              }
              uVar41 = uVar41 + 1;
              count = (pointer)(pMVar33->m_referenceMemory).m_atomSize;
            } while (uVar41 < (ulong)pMVar51 / (ulong)count);
          }
          uVar45 = uVar45 + 1;
          uVar41 = ((long)(local_f8._8_8_ - local_f8._0_8_) >> 3) * -0x3333333333333333;
        } while (uVar45 < uVar41);
      }
      pMVar33 = (MemoryObject_conflict *)0x0;
      if (local_f8._0_8_ != local_f8._8_8_) {
        pMVar33 = (MemoryObject_conflict *)local_f8._0_8_;
      }
      VVar30 = (*local_b8->_vptr_DeviceInterface[10])(local_b8,local_a0,uVar41,pMVar33);
      ::vk::checkResult(VVar30,
                        "vkd.invalidateMappedMemoryRanges(device, (deUint32)ranges.size(), ranges.empty() ? DE_NULL : &ranges[0])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                        ,0x310);
      pMVar33 = (MemoryObject_conflict *)local_f8._0_8_;
      pVVar21 = (pointer)local_f8._16_8_;
    }
  }
  if (pMVar33 != (MemoryObject_conflict *)0x0) {
    operator_delete(pMVar33,(long)pVVar21 - (long)pMVar33);
  }
LAB_0068189b:
  pTVar55 = local_48;
  sVar38 = local_a8->m_opNdx + 1;
  local_a8->m_opNdx = sVar38;
  if (sVar38 == 100) {
    local_f8._0_8_ = (value_type)(local_f8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Pass","");
    pTVar55 = local_48;
    local_48->m_code = QP_TEST_RESULT_PASS;
    (local_48->m_description)._M_dataplus._M_p = (pointer)&(local_48->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48->m_description,local_f8._0_8_,
               (undefined1 *)((long)&((VkMemoryHeap *)local_f8._8_8_)->size + local_f8._0_8_));
    if ((value_type)local_f8._0_8_ != (value_type)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,(ulong)((long)(VkStructureType *)local_f8._16_8_ + 1));
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  return pTVar55;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const size_t			opCount						= 100;
		const float				memoryOpProbability			= 0.5f;		// 0.50
		const float				flushInvalidateProbability	= 0.4f;		// 0.20
		const float				mapProbability				= 0.50f;	// 0.15
		const float				unmapProbability			= 0.25f;	// 0.075

		const float				allocProbability			= 0.75f; // Versun free

		const VkDevice			device						= m_context.getDevice();
		const DeviceInterface&	vkd							= m_context.getDeviceInterface();

		const VkDeviceSize		sysMemUsage					= (m_memoryLimits.totalDeviceLocalMemory == 0)
															? m_totalMemTracker.getTotalUsage()
															: m_totalMemTracker.getUsage(MEMORY_CLASS_SYSTEM);

		if (!m_memoryMappings.empty() && m_rng.getFloat() < memoryOpProbability)
		{
			// Perform operations on mapped memory
			MemoryMapping* const	mapping	= m_rng.choose<MemoryMapping*>(m_memoryMappings.begin(), m_memoryMappings.end());

			enum Op
			{
				OP_READ = 0,
				OP_WRITE,
				OP_MODIFY,
				OP_LAST
			};

			const Op op = (Op)(m_rng.getUint32() % OP_LAST);

			switch (op)
			{
				case OP_READ:
					mapping->randomRead(m_rng);
					break;

				case OP_WRITE:
					mapping->randomWrite(m_rng);
					break;

				case OP_MODIFY:
					mapping->randomModify(m_rng);
					break;

				default:
					DE_FATAL("Invalid operation");
			}
		}
		else if (!m_mappedMemoryObjects.empty() && m_rng.getFloat() < flushInvalidateProbability)
		{
			MemoryObject* const	object	= m_rng.choose<MemoryObject*>(m_mappedMemoryObjects.begin(), m_mappedMemoryObjects.end());

			if (m_rng.getBool())
				object->randomFlush(vkd, device, m_rng);
			else
				object->randomInvalidate(vkd, device, m_rng);
		}
		else if (!m_mappedMemoryObjects.empty() && m_rng.getFloat() < unmapProbability)
		{
			// Unmap memory object
			MemoryObject* const	object	= m_rng.choose<MemoryObject*>(m_mappedMemoryObjects.begin(), m_mappedMemoryObjects.end());

			// Remove mapping
			removeFirstEqual(m_memoryMappings, object->getMapping());

			object->unmap();
			removeFirstEqual(m_mappedMemoryObjects, object);
			m_nonMappedMemoryObjects.push_back(object);

			m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryMappingSysMemSize);
		}
		else if (!m_nonMappedMemoryObjects.empty() &&
				 (m_rng.getFloat() < mapProbability) &&
				 (sysMemUsage+m_memoryMappingSysMemSize <= (VkDeviceSize)m_memoryLimits.totalSystemMemory))
		{
			// Map memory object
			MemoryObject* const		object	= m_rng.choose<MemoryObject*>(m_nonMappedMemoryObjects.begin(), m_nonMappedMemoryObjects.end());
			MemoryMapping*			mapping	= object->mapRandom(vkd, device, m_rng);

			m_memoryMappings.push_back(mapping);
			m_mappedMemoryObjects.push_back(object);
			removeFirstEqual(m_nonMappedMemoryObjects, object);

			m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryMappingSysMemSize);
		}
		else
		{
			// Sort heaps based on capacity (full or not)
			vector<MemoryHeap*>		nonFullHeaps;
			vector<MemoryHeap*>		nonEmptyHeaps;

			if (sysMemUsage+m_memoryObjectSysMemSize <= (VkDeviceSize)m_memoryLimits.totalSystemMemory)
			{
				// For the duration of sorting reserve MemoryObject space from system memory
				m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);

				for (vector<de::SharedPtr<MemoryHeap> >::const_iterator heapIter = m_memoryHeaps.begin();
					 heapIter != m_memoryHeaps.end();
					 ++heapIter)
				{
					if (!(*heapIter)->full())
						nonFullHeaps.push_back(heapIter->get());

					if (!(*heapIter)->empty())
						nonEmptyHeaps.push_back(heapIter->get());
				}

				m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);
			}
			else
			{
				// Not possible to even allocate MemoryObject from system memory, look for non-empty heaps
				for (vector<de::SharedPtr<MemoryHeap> >::const_iterator heapIter = m_memoryHeaps.begin();
					 heapIter != m_memoryHeaps.end();
					 ++heapIter)
				{
					if (!(*heapIter)->empty())
						nonEmptyHeaps.push_back(heapIter->get());
				}
			}

			if (!nonFullHeaps.empty() && (nonEmptyHeaps.empty() || m_rng.getFloat() < allocProbability))
			{
				// Reserve MemoryObject from sys mem first
				m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);

				// Allocate more memory objects
				MemoryHeap* const	heap	= m_rng.choose<MemoryHeap*>(nonFullHeaps.begin(), nonFullHeaps.end());
				MemoryObject* const	object	= heap->allocateRandom(vkd, device, m_rng);

				m_nonMappedMemoryObjects.push_back(object);
			}
			else
			{
				// Free memory objects
				MemoryHeap* const		heap	= m_rng.choose<MemoryHeap*>(nonEmptyHeaps.begin(), nonEmptyHeaps.end());
				MemoryObject* const		object	= heap->getRandomObject(m_rng);

				// Remove mapping
				if (object->getMapping())
				{
					removeFirstEqual(m_memoryMappings, object->getMapping());
					m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, m_memoryMappingSysMemSize);
				}

				removeFirstEqual(m_mappedMemoryObjects, object);
				removeFirstEqual(m_nonMappedMemoryObjects, object);

				heap->free(object);
				m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);
			}
		}

		m_opNdx += 1;
		if (m_opNdx == opCount)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::incomplete();
	}